

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cxxopts.hpp
# Opt level: O1

void cxxopts::values::parse_value<std::__cxx11::string>
               (string *text,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *value)

{
  istream *piVar1;
  long local_1f8;
  stringstream in;
  byte abStack_1d8 [96];
  ios_base local_178 [264];
  size_type *local_70;
  string token;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> v;
  
  std::__cxx11::stringstream::stringstream((stringstream *)&local_1f8,(string *)text,_S_out|_S_in);
  local_70 = &token._M_string_length;
  token._M_dataplus._M_p = (pointer)0x0;
  token._M_string_length._0_1_ = 0;
  if ((abStack_1d8[*(long *)(local_1f8 + -0x18)] & 2) == 0) {
    do {
      piVar1 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                         ((istream *)&local_1f8,(string *)&local_70,',');
      if (((byte)piVar1[*(long *)(*(long *)piVar1 + -0x18) + 0x20] & 5) != 0) break;
      v._M_dataplus._M_p = (pointer)0x0;
      v._M_string_length._0_1_ = 0;
      token.field_2._8_8_ = &v._M_string_length;
      std::__cxx11::string::_M_assign((string *)(token.field_2._M_local_buf + 8));
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)value,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 (token.field_2._M_local_buf + 8));
      if ((size_type *)token.field_2._8_8_ != &v._M_string_length) {
        operator_delete((void *)token.field_2._8_8_,
                        CONCAT71(v._M_string_length._1_7_,(undefined1)v._M_string_length) + 1);
      }
    } while ((abStack_1d8[*(long *)(local_1f8 + -0x18)] & 2) == 0);
  }
  if (local_70 != &token._M_string_length) {
    operator_delete(local_70,CONCAT71(token._M_string_length._1_7_,
                                      (undefined1)token._M_string_length) + 1);
  }
  std::__cxx11::stringstream::~stringstream((stringstream *)&local_1f8);
  std::ios_base::~ios_base(local_178);
  return;
}

Assistant:

void
    parse_value(const std::string& text, std::vector<T>& value)
    {
      std::stringstream in(text);
      std::string token;
      while(!in.eof() && std::getline(in, token, CXXOPTS_VECTOR_DELIMITER)) {
        T v;
        parse_value(token, v);
        value.emplace_back(std::move(v));
      }
    }